

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_s2point_vector.cc
# Opt level: O0

void s2coding::EncodeS2PointVectorCompact(Span<const_Vector3<double>_> points,Encoder *encoder)

{
  byte bVar1;
  Encoder *this;
  int iVar2;
  size_type sVar3;
  unsigned_long *puVar4;
  reference pvVar5;
  ostream *poVar6;
  unsigned_long_long *puVar7;
  uint64 uVar8;
  reference __x;
  char *pcVar9;
  size_t sVar10;
  Vector3<double> *src;
  Encoder *in_RCX;
  undefined8 *in_R8;
  Span<const_Vector3<double>_> points_00;
  Span<const_Vector3<double>_> points_01;
  Span<const_unsigned_long_long> values_00;
  BlockCode BVar11;
  int exceptions_bytes;
  uint8 last_byte;
  S2LogMessageVoidify local_2ca;
  byte local_2c9;
  S2LogMessage local_2c8;
  S2LogMessageVoidify local_2b2;
  byte local_2b1;
  S2LogMessage local_2b0;
  S2LogMessageVoidify local_299;
  size_type local_298;
  uint64 delta;
  int local_288;
  int j_1;
  int delta_bytes;
  S2LogMessageVoidify local_26d;
  int local_26c;
  unsigned_long_long uStack_268;
  int offset_shift;
  byte local_259;
  S2LogMessage local_258;
  S2LogMessageVoidify local_241;
  int local_240;
  int local_23c;
  int j;
  int num_exceptions;
  uint64 offset;
  S2LogMessage local_228;
  S2LogMessageVoidify local_212;
  byte local_211;
  S2LogMessage local_210;
  S2LogMessageVoidify local_1fa;
  byte local_1f9;
  S2LogMessage local_1f8;
  S2LogMessageVoidify local_1e5;
  int local_1e4;
  uint local_1e0;
  int overlap_nibbles;
  int delta_nibbles;
  int offset_bytes;
  Encoder *block;
  int local_1c8;
  Span<unsigned_long_long> local_1c0;
  s2coding *local_1b0;
  pointer local_1a8;
  undefined8 local_1a0;
  BlockCode code;
  int local_184;
  int block_size;
  int i;
  uint64 exceptions_sum;
  uint64 delta_nibbles_sum;
  uint64 offset_bytes_sum;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> exceptions;
  StringVectorEncoder blocks;
  int base_shift;
  S2LogMessageVoidify local_fa;
  byte local_f9;
  S2LogMessage local_f8;
  S2LogMessageVoidify local_e2;
  byte local_e1;
  S2LogMessage local_e0;
  S2LogMessageVoidify local_ca;
  byte local_c9;
  S2LogMessage local_c8;
  S2LogMessageVoidify local_b5;
  uint local_b4;
  int local_b0;
  int last_block_count;
  int base_bytes;
  int num_blocks;
  uint64 base;
  undefined1 local_98 [4];
  int base_bits;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> values;
  bool have_exceptions;
  undefined1 local_38 [4];
  int level;
  vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> cell_points;
  Encoder *encoder_local;
  Span<const_Vector3<double>_> points_local;
  
  points_local.ptr_ = (pointer)points.len_;
  encoder_local = (Encoder *)points.ptr_;
  cell_points.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)encoder;
  std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>::vector
            ((vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *)local_38);
  points_00.len_ = (size_type)local_38;
  points_00.ptr_ = points_local.ptr_;
  iVar2 = ChooseBestLevel((s2coding *)encoder_local,points_00,
                          (vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *)
                          in_RCX);
  if (iVar2 < 0) {
    points_01.len_ =
         (size_type)
         cell_points.super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    points_01.ptr_ = points_local.ptr_;
    EncodeS2PointVectorFast((s2coding *)encoder_local,points_01,in_RCX);
    values.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    ConvertCellsToValues
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_98,
               (vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *)local_38,iVar2,
               (bool *)((long)&values.
                               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
    _base_bytes = ChooseBase((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                             local_98,iVar2,
                             (bool)(values.
                                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1),
                             (int *)((long)&base + 4));
    sVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_98);
    last_block_count = (int)(sVar3 + 0xf >> 4);
    local_b0 = base._4_4_ >> 3;
    Encoder::Ensure((Encoder *)
                    cell_points.
                    super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(long)(local_b0 + 2));
    sVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                      ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_98);
    local_b4 = (int)sVar3 + (last_block_count + -1) * -0x10;
    local_c9 = 0;
    if ((int)local_b4 < 0) {
      in_R8 = &std::cerr;
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_c8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1ae,kFatal,(ostream *)&std::cerr);
      local_c9 = 1;
      poVar6 = S2LogMessage::stream(&local_c8);
      poVar6 = std::operator<<(poVar6,"Check failed: (last_block_count) >= (0) ");
      S2LogMessageVoidify::operator&(&local_b5,poVar6);
    }
    if ((local_c9 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_c8);
    }
    local_e1 = 0;
    if (0x10 < local_b4) {
      in_R8 = &std::cerr;
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1af,kFatal,(ostream *)&std::cerr);
      local_e1 = 1;
      poVar6 = S2LogMessage::stream(&local_e0);
      poVar6 = std::operator<<(poVar6,"Check failed: (last_block_count) <= (kBlockSize) ");
      S2LogMessageVoidify::operator&(&local_ca,poVar6);
    }
    if ((local_e1 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_e0);
    }
    local_f9 = 0;
    if (7 < local_b0) {
      in_R8 = &std::cerr;
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_f8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1b0,kFatal,(ostream *)&std::cerr);
      local_f9 = 1;
      poVar6 = S2LogMessage::stream(&local_f8);
      poVar6 = std::operator<<(poVar6,"Check failed: (base_bytes) <= (7) ");
      S2LogMessageVoidify::operator&(&local_e2,poVar6);
    }
    if ((local_f9 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_f8);
    }
    if (0x1e < iVar2) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&base_shift,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                 ,0x1b1,kFatal,(ostream *)&std::cerr);
      poVar6 = S2LogMessage::stream((S2LogMessage *)&base_shift);
      poVar6 = std::operator<<(poVar6,"Check failed: (level) <= (30) ");
      S2LogMessageVoidify::operator&(&local_fa,poVar6);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&base_shift);
    }
    Encoder::put8((Encoder *)
                  cell_points.
                  super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (char)(local_b4 << 4) + -0xf +
                  (values.
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) * '\b');
    Encoder::put8((Encoder *)
                  cell_points.
                  super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (byte)local_b0 | (byte)(iVar2 << 3));
    iVar2 = BaseShift(iVar2,base._4_4_);
    blocks.data_.orig_._0_1_ = (byte)iVar2;
    EncodeUintWithLength<unsigned_long_long>
              (_base_bytes >> ((byte)blocks.data_.orig_ & 0x3f),local_b0,
               (Encoder *)
               cell_points.
               super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    StringVectorEncoder::StringVectorEncoder
              ((StringVectorEncoder *)
               &exceptions.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&offset_bytes_sum);
    for (local_184 = 0;
        sVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                          ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                           local_98), (ulong)(long)local_184 < sVar3; local_184 = local_184 + 0x10)
    {
      sVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                        ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_98
                        );
      register0x00000000 = sVar3 - (long)local_184;
      puVar4 = std::min<unsigned_long>(&kBlockSize,(unsigned_long *)&code.overlap_bits);
      iVar2 = (int)*puVar4;
      pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_98,(long)local_184);
      local_1c0 = absl::MakeSpan<unsigned_long_long>(pvVar5,(long)iVar2);
      absl::Span<unsigned_long_long_const>::
      Span<absl::Span<unsigned_long_long>,void,absl::Span<unsigned_long_long>>
                ((Span<unsigned_long_long_const> *)&local_1b0,&local_1c0);
      values_00.len_ = _base_bytes;
      values_00.ptr_ = local_1a8;
      BVar11 = GetBlockCode(local_1b0,values_00,
                            (ulong)(values.
                                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1),
                            SUB81(in_R8,0));
      local_1c8 = BVar11.overlap_bits;
      block = BVar11._0_8_;
      local_1a0 = block;
      code.delta_bits = local_1c8;
      _delta_nibbles =
           StringVectorEncoder::AddViaEncoder
                     ((StringVectorEncoder *)
                      &exceptions.
                       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      overlap_nibbles = local_1a0._4_4_ >> 3;
      local_1e0 = (int)local_1a0 >> 2;
      local_1e4 = code.delta_bits >> 2;
      Encoder::Ensure(_delta_nibbles,(long)overlap_nibbles + 1 + (long)(int)local_1e0 * 8);
      local_1f9 = 0;
      if (7 < overlap_nibbles - local_1e4) {
        in_R8 = &std::cerr;
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_1f8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x1cc,kFatal,(ostream *)&std::cerr);
        local_1f9 = 1;
        poVar6 = S2LogMessage::stream(&local_1f8);
        poVar6 = std::operator<<(poVar6,"Check failed: (offset_bytes - overlap_nibbles) <= (7) ");
        S2LogMessageVoidify::operator&(&local_1e5,poVar6);
      }
      if ((local_1f9 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_1f8);
      }
      local_211 = 0;
      if (1 < local_1e4) {
        in_R8 = &std::cerr;
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_210,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x1cd,kFatal,(ostream *)&std::cerr);
        local_211 = 1;
        poVar6 = S2LogMessage::stream(&local_210);
        poVar6 = std::operator<<(poVar6,"Check failed: (overlap_nibbles) <= (1) ");
        S2LogMessageVoidify::operator&(&local_1fa,poVar6);
      }
      if ((local_211 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_210);
      }
      offset._7_1_ = 0;
      if (0x10 < (int)local_1e0) {
        in_R8 = &std::cerr;
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_228,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x1ce,kFatal,(ostream *)&std::cerr);
        offset._7_1_ = 1;
        poVar6 = S2LogMessage::stream(&local_228);
        poVar6 = std::operator<<(poVar6,"Check failed: (delta_nibbles) <= (16) ");
        S2LogMessageVoidify::operator&(&local_212,poVar6);
      }
      if ((offset._7_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_228);
      }
      Encoder::put8(_delta_nibbles,
                    (char)overlap_nibbles - (char)local_1e4 | (byte)(local_1e4 << 3) |
                    (char)(local_1e0 << 4) - 0x10U);
      _j = 0xffffffffffffffff;
      local_23c = 0;
      for (local_240 = 0; local_240 < iVar2; local_240 = local_240 + 1) {
        pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                            local_98,(long)(local_184 + local_240));
        if (*pvVar5 == 0xffffffffffffffff) {
          local_23c = local_23c + 1;
        }
        else {
          pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                             ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                              local_98,(long)(local_184 + local_240));
          local_259 = 0;
          if (*pvVar5 < _base_bytes) {
            in_R8 = &std::cerr;
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_258,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                       ,0x1d9,kFatal,(ostream *)&std::cerr);
            local_259 = 1;
            poVar6 = S2LogMessage::stream(&local_258);
            poVar6 = std::operator<<(poVar6,"Check failed: (values[i + j]) >= (base) ");
            S2LogMessageVoidify::operator&(&local_241,poVar6);
          }
          if ((local_259 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_258);
          }
          pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                             ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                              local_98,(long)(local_184 + local_240));
          uStack_268 = *pvVar5 - _base_bytes;
          puVar7 = std::min<unsigned_long_long>((unsigned_long_long *)&j,&stack0xfffffffffffffd98);
          _j = *puVar7;
        }
      }
      if (local_23c == iVar2) {
        _j = 0;
      }
      local_26c = (int)local_1a0 - code.delta_bits;
      uVar8 = BitMask(local_26c);
      _j = (uVar8 ^ 0xffffffffffffffff) & _j;
      j_1._3_1_ = 0;
      if ((_j == 0) != (overlap_nibbles == 0)) {
        in_R8 = &std::cerr;
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&delta_bytes,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                   ,0x1e2,kFatal,(ostream *)&std::cerr);
        j_1._3_1_ = 1;
        poVar6 = S2LogMessage::stream((S2LogMessage *)&delta_bytes);
        poVar6 = std::operator<<(poVar6,"Check failed: (offset == 0) == (offset_bytes == 0) ");
        S2LogMessageVoidify::operator&(&local_26d,poVar6);
      }
      if ((j_1._3_1_ & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&delta_bytes);
      }
      if (_j != 0) {
        EncodeUintWithLength<unsigned_long_long>
                  (_j >> ((byte)local_26c & 0x3f),overlap_nibbles,_delta_nibbles);
      }
      local_288 = (int)(local_1e0 + 1) >> 1;
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&offset_bytes_sum);
      for (delta._4_4_ = 0; (int)delta._4_4_ < iVar2; delta._4_4_ = delta._4_4_ + 1) {
        pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                            local_98,(long)(int)(local_184 + delta._4_4_));
        if (*pvVar5 == 0xffffffffffffffff) {
          local_298 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                                 &offset_bytes_sum);
          __x = absl::Span<const_Vector3<double>_>::operator[]
                          ((Span<const_Vector3<double>_> *)&encoder_local,
                           (long)(int)(local_184 + delta._4_4_));
          std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                    ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&offset_bytes_sum
                     ,__x);
        }
        else {
          pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                             ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                              local_98,(long)(int)(local_184 + delta._4_4_));
          local_2b1 = 0;
          if (*pvVar5 < _j + _base_bytes) {
            in_R8 = &std::cerr;
            S2FatalLogMessage::S2FatalLogMessage
                      ((S2FatalLogMessage *)&local_2b0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                       ,0x1f0,kFatal,(ostream *)&std::cerr);
            local_2b1 = 1;
            poVar6 = S2LogMessage::stream(&local_2b0);
            poVar6 = std::operator<<(poVar6,"Check failed: (values[i + j]) >= (offset + base) ");
            S2LogMessageVoidify::operator&(&local_299,poVar6);
          }
          if ((local_2b1 & 1) != 0) {
            S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_2b0);
          }
          pvVar5 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                             ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                              local_98,(long)(int)(local_184 + delta._4_4_));
          local_298 = *pvVar5 - (_j + _base_bytes);
          if ((values.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
            local_2c9 = 0;
            if (0xffffffffffffffef < local_298) {
              in_R8 = &std::cerr;
              S2FatalLogMessage::S2FatalLogMessage
                        ((S2FatalLogMessage *)&local_2c8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                         ,499,kFatal,(ostream *)&std::cerr);
              local_2c9 = 1;
              poVar6 = S2LogMessage::stream(&local_2c8);
              poVar6 = std::operator<<(poVar6,"Check failed: (delta) <= (~0ULL - kBlockSize) ");
              S2LogMessageVoidify::operator&(&local_2b2,poVar6);
            }
            if ((local_2c9 & 1) != 0) {
              S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_2c8);
            }
            local_298 = local_298 + 0x10;
          }
        }
        sVar3 = local_298;
        uVar8 = BitMask((int)local_1a0);
        if (uVar8 < sVar3) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&exceptions_bytes,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_s2point_vector.cc"
                     ,0x1f7,kFatal,(ostream *)&std::cerr);
          poVar6 = S2LogMessage::stream((S2LogMessage *)&exceptions_bytes);
          poVar6 = std::operator<<(poVar6,"Check failed: (delta) <= (BitMask(code.delta_bits)) ");
          S2LogMessageVoidify::operator&(&local_2ca,poVar6);
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&exceptions_bytes);
        }
        if (((local_1e0 & 1) != 0) && ((delta._4_4_ & 1) != 0)) {
          pcVar9 = Encoder::base(_delta_nibbles);
          sVar10 = Encoder::length(_delta_nibbles);
          bVar1 = pcVar9[sVar10 - 1];
          Encoder::RemoveLast(_delta_nibbles,1);
          local_298 = local_298 << 4 | (long)(int)(bVar1 & 0xf);
        }
        EncodeUintWithLength<unsigned_long_long>(local_298,local_288,_delta_nibbles);
      }
      if (0 < local_23c) {
        sVar3 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                          ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                           &offset_bytes_sum);
        iVar2 = (int)sVar3 * 0x18;
        Encoder::Ensure(_delta_nibbles,(long)iVar2);
        this = _delta_nibbles;
        src = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::data
                        ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                         &offset_bytes_sum);
        Encoder::putn(this,src,(long)iVar2);
      }
    }
    StringVectorEncoder::Encode
              ((StringVectorEncoder *)
               &exceptions.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (Encoder *)
               cell_points.
               super__Vector_base<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&offset_bytes_sum);
    StringVectorEncoder::~StringVectorEncoder
              ((StringVectorEncoder *)
               &exceptions.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_98);
    values.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_>::~vector
            ((vector<s2coding::CellPoint,_std::allocator<s2coding::CellPoint>_> *)local_38);
  return;
}

Assistant:

void EncodeS2PointVectorCompact(Span<const S2Point> points, Encoder* encoder) {
  // OVERVIEW
  // --------
  //
  // We attempt to represent each S2Point as the center of an S2CellId.  All
  // S2CellIds must be at the same level.  Any points that cannot be encoded
  // exactly as S2CellId centers are stored as exceptions using 24 bytes each.
  // If there are so many exceptions that the CELL_IDS encoding does not save
  // significant space, we give up and use the uncompressed encoding.
  //
  // The first step is to choose the best S2CellId level.  This requires
  // converting each point to (face, si, ti) coordinates and checking whether
  // the point can be represented exactly as an S2CellId center at some level.
  // We then build a histogram of S2CellId levels (just like the similar code
  // in S2Polygon::Encode) and choose the best level (or give up, if there are
  // not enough S2CellId-encodable points).
  //
  // The simplest approach would then be to take all the S2CellIds and
  // right-shift them to remove all the constant bits at the chosen level.
  // This would give the best spatial locality and hence the smallest deltas.
  // However instead we give up some spatial locality and use the similar but
  // faster transformation described below.
  //
  // Each encodable point is first converted to the (sj, tj) representation
  // defined below:
  //
  //   sj = (((face & 3) << 30) | (si >> 1)) >> (30 - level);
  //   tj = (((face & 4) << 29) | ti) >> (31 - level);
  //
  // These two values encode the (face, si, ti) tuple using (2 * level + 3)
  // bits.  To see this, recall that "si" and "ti" are 31-bit values that all
  // share a common suffix consisting of a "1" bit followed by (30 - level)
  // "0" bits.  The code above right-shifts these values to remove the
  // constant bits and then prepends the bits for "face", yielding a total of
  // (level + 2) bits for "sj" and (level + 1) bits for "tj".
  //
  // We then combine (sj, tj) into one 64-bit value by interleaving bit pairs:
  //
  //   v = InterleaveBitPairs(sj, tj);
  //
  // (We could also interleave individual bits, but it is faster this way.)
  // The result is similar to right-shifting an S2CellId by (61 - 2 * level),
  // except that it is faster to decode and the spatial locality is not quite
  // as good.
  //
  // The 64-bit values are divided into blocks of size 8, and then each value is
  // encoded as the sum of a base value, a per-block offset, and a per-value
  // delta within that block:
  //
  //   v[i,j] = base + offset[i] + delta[i, j]
  //
  // where "i" represents a block and "j" represents an entry in that block.
  //
  // The deltas for each block are encoded using a fixed number of 4-bit nibbles
  // (1-16 nibbles per delta).  This allows any delta to be accessed in constant
  // time.
  //
  // The "offset" for each block is a 64-bit value encoded in 0-8 bytes.  The
  // offset is left-shifted such that it overlaps the deltas by a configurable
  // number of bits (either 0 or 4), called the "overlap".  The overlap and
  // offset length (0-8 bytes) are specified per block.  The reason for the
  // overlap is that it allows fewer delta bits to be used in some cases.  For
  // example if base == 0 and the range within a block is 0xf0 to 0x110, then
  // rather than using 12-bits deltas with an offset of 0, the overlap lets us
  // use 8-bits deltas with an offset of 0xf0 (saving 7 bytes per block).
  //
  // The global minimum value "base" is encoded using 0-7 bytes starting with
  // the most-significant non-zero bit possible for the chosen level.  For
  // example, if (level == 7) then the encoded values have at most 17 bits, so
  // if "base" is encoded in 1 byte then it is shifted to occupy bits 9-16.
  //
  // Example: at level == 15, there are at most 33 non-zero value bits.  The
  // following shows the bit positions covered by "base", "offset", and "delta"
  // assuming that "base" and "offset" are encoded in 2 bytes each, deltas are
  // encoded in 2 nibbles (1 byte) each, and "overlap" is 4 bits:
  //
  //   Base:             1111111100000000-----------------
  //   Offset:           -------------1111111100000000----
  //   Delta:            -------------------------00000000
  //   Overlap:                                   ^^^^
  //
  // The numbers (0 or 1) in this diagram denote the byte number of the encoded
  // value.  Notice that "base" is shifted so that it starts at the leftmost
  // possible bit, "delta" always starts at the rightmost possible bit (bit 0),
  // and "offset" is shifted so that it overlaps "delta" by the chosen "overlap"
  // (either 0 or 4 bits).  Also note that all of these values are summed, and
  // therefore each value can affect higher-order bits due to carries.
  //
  // NOTE(ericv): Encoding deltas in 4-bit rather than 8-bit length increments
  // reduces encoded sizes by about 7%.  Allowing a 4-bit overlap between the
  // offset and deltas reduces encoded sizes by about 1%.  Both optimizations
  // make the code more complex but don't affect running times significantly.
  //
  // ENCODING DETAILS
  // ----------------
  //
  // Now we can move on to the actual encodings.  First, there is a 2 byte
  // header encoded as follows:
  //
  //  Byte 0, bits 0-2: encoding_format (CELL_IDS)
  //  Byte 0, bit  3:   have_exceptions
  //  Byte 0, bits 4-7: (last_block_size - 1)
  //  Byte 1, bits 0-2: base_bytes
  //  Byte 1, bits 3-7: level (0-30)
  //
  // This is followed by an EncodedStringVector containing the encoded blocks.
  // Each block contains kBlockSize (8) values.  The total size of the
  // EncodeS2PointVector is not stored explicity, but instead is calculated as
  //
  //     num_values == kBlockSize * (num_blocks - 1) + last_block_size .
  //
  // (An empty vector has num_blocks == 0 and last_block_size == kBlockSize.)
  //
  // Each block starts with a 1 byte header containing the following:
  //
  //  Byte 0, bits 0-2: (offset_bytes - overlap_nibbles)
  //  Byte 0, bit  3:   overlap_nibbles
  //  Byte 0, bits 4-7: (delta_nibbles - 1)
  //
  // "overlap_nibbles" is either 0 or 1 (indicating an overlap of 0 or 4 bits),
  // while "offset_bytes" is in the range 0-8 (indicating the number of bytes
  // used to encode the offset for this block).  Note that some combinations
  // cannot be encoded: in particular, offset_bytes == 0 can only be encoded
  // with an overlap of 0 bits, and offset_bytes == 8 can only be encoded with
  // an overlap of 4 bits.  This allows us to encode offset lengths of 0-8
  // rather than just 0-7 without using an extra bit.  (Note that the
  // combinations that can't be encoded are not useful anyway.)
  //
  // The header is followed by "offset_bytes" bytes for the offset, and then
  // (4 * delta_nibbles) bytes for the deltas.
  //
  // If there are any points that could not be represented as S2CellIds, then
  // "have_exceptions" in the header is true.  In that case the delta values
  // within each block are encoded as (delta + 8), and values 0-7 are used to
  // represent exceptions.  If a block has exceptions, they are encoded
  // immediately following the array of deltas, and are referenced by encoding
  // the corresponding exception index (0-7) as the delta.
  //
  // TODO(ericv): A vector containing a single leaf cell is currently encoded as
  // 13 bytes (2 byte header, 7 byte base, 1 byte block count, 1 byte block
  // length, 1 byte block header, 1 byte delta).  However if this case occurs
  // often, a better solution would be implement a separate format that encodes
  // the leading k bytes of an S2CellId.  It would have a one-byte header
  // consisting of the encoding format (3 bits) and the number of bytes encoded
  // (3 bits), followed by the S2CellId bytes.  The extra 2 header bits could be
  // used to store single points using other encodings, e.g. E7.
  //
  // If we wind up using 8-value blocks, we could also use the extra bit in the
  // first byte of the header to indicate that there is only one value, and
  // then skip the 2nd byte of header and the EncodedStringVector.  But this
  // would be messy because it also requires special cases while decoding.
  // Essentially this would be a sub-format within the CELL_IDS format.

  // 1. Compute (level, face, si, ti) for each point, build a histogram of
  // levels, and determine the optimal level to use for encoding (if any).
  vector<CellPoint> cell_points;
  int level = ChooseBestLevel(points, &cell_points);
  if (level < 0) {
    return EncodeS2PointVectorFast(points, encoder);
  }

  // 2. Convert the points into encodable 64-bit values.  We don't use the
  // S2CellId itself because it requires a somewhat more complicated bit
  // interleaving operation.
  //
  // TODO(ericv): Benchmark using shifted S2CellIds instead.
  bool have_exceptions;
  vector<uint64> values = ConvertCellsToValues(cell_points, level,
                                               &have_exceptions);

  // 3. Choose the global encoding parameter "base" (consisting of the bit
  // prefix shared by all values to be encoded).
  int base_bits;
  uint64 base = ChooseBase(values, level, have_exceptions, &base_bits);

  // Now encode the output, starting with the 2-byte header (see above).
  int num_blocks = (values.size() + kBlockSize - 1) >> kBlockShift;
  int base_bytes = base_bits >> 3;
  encoder->Ensure(2 + base_bytes);
  int last_block_count = values.size() - kBlockSize * (num_blocks - 1);
  S2_DCHECK_GE(last_block_count, 0);
  S2_DCHECK_LE(last_block_count, kBlockSize);
  S2_DCHECK_LE(base_bytes, 7);
  S2_DCHECK_LE(level, 30);
  encoder->put8(EncodedS2PointVector::CELL_IDS |
                (have_exceptions << 3) |
                ((last_block_count - 1) << 4));
  encoder->put8(base_bytes | (level << 3));

  // Next we encode 0-7 bytes of "base".
  int base_shift = BaseShift(level, base_bits);
  EncodeUintWithLength(base >> base_shift, base_bytes, encoder);

  // Now we encode the contents of each block.
  StringVectorEncoder blocks;
  vector<S2Point> exceptions;
  uint64 offset_bytes_sum = 0;
  uint64 delta_nibbles_sum = 0;
  uint64 exceptions_sum = 0;
  for (int i = 0; i < values.size(); i += kBlockSize) {
    int block_size = min(kBlockSize, values.size() - i);
    BlockCode code = GetBlockCode(MakeSpan(&values[i], block_size),
                                  base, have_exceptions);

    // Encode the one-byte block header (see above).
    Encoder* block = blocks.AddViaEncoder();
    int offset_bytes = code.offset_bits >> 3;
    int delta_nibbles = code.delta_bits >> 2;
    int overlap_nibbles = code.overlap_bits >> 2;
    block->Ensure(1 + offset_bytes + (kBlockSize / 2) * delta_nibbles);
    S2_DCHECK_LE(offset_bytes - overlap_nibbles, 7);
    S2_DCHECK_LE(overlap_nibbles, 1);
    S2_DCHECK_LE(delta_nibbles, 16);
    block->put8((offset_bytes - overlap_nibbles) |
                (overlap_nibbles << 3) | (delta_nibbles - 1) << 4);

    // Determine the offset for this block, and whether there are exceptions.
    uint64 offset = ~0ULL;
    int num_exceptions = 0;
    for (int j = 0; j < block_size; ++j) {
      if (values[i + j] == kException) {
        num_exceptions += 1;
      } else {
        S2_DCHECK_GE(values[i + j], base);
        offset = min(offset, values[i + j] - base);
      }
    }
    if (num_exceptions == block_size) offset = 0;

    // Encode the offset.
    int offset_shift = code.delta_bits - code.overlap_bits;
    offset &= ~BitMask(offset_shift);
    S2_DCHECK_EQ(offset == 0, offset_bytes == 0);
    if (offset > 0) {
      EncodeUintWithLength(offset >> offset_shift, offset_bytes, block);
    }

    // Encode the deltas, and also gather any exceptions present.
    int delta_bytes = (delta_nibbles + 1) >> 1;
    exceptions.clear();
    for (int j = 0; j < block_size; ++j) {
      uint64 delta;
      if (values[i + j] == kException) {
        delta = exceptions.size();
        exceptions.push_back(points[i + j]);
      } else {
        S2_DCHECK_GE(values[i + j], offset + base);
        delta = values[i + j] - (offset + base);
        if (have_exceptions) {
          S2_DCHECK_LE(delta, ~0ULL - kBlockSize);
          delta += kBlockSize;
        }
      }
      S2_DCHECK_LE(delta, BitMask(code.delta_bits));
      if ((delta_nibbles & 1) && (j & 1)) {
        // Combine this delta with the high-order 4 bits of the previous delta.
        uint8 last_byte = *(block->base() + block->length() - 1);
        block->RemoveLast(1);
        delta = (delta << 4) | (last_byte & 0xf);
      }
      EncodeUintWithLength(delta, delta_bytes, block);
    }
    // Append any exceptions to the end of the block.
    if (num_exceptions > 0) {
      int exceptions_bytes = exceptions.size() * sizeof(S2Point);
      block->Ensure(exceptions_bytes);
      block->putn(exceptions.data(), exceptions_bytes);
    }
    offset_bytes_sum += offset_bytes;
    delta_nibbles_sum += delta_nibbles;
    exceptions_sum += num_exceptions;
  }
  blocks.Encode(encoder);
}